

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O3

RealType __thiscall OpenMD::NPA::calcConservedQuantity(NPA *this)

{
  Thermo *this_00;
  double dVar1;
  double dVar2;
  double *pdVar3;
  uint i;
  long lVar4;
  Mat3x3d *pMVar5;
  double *pdVar6;
  uint j;
  long lVar7;
  Mat3x3d *pMVar8;
  uint k;
  long lVar9;
  RealType RVar10;
  double dVar11;
  RealType RVar12;
  undefined1 auVar13 [16];
  SquareMatrix3<double> result_1;
  SquareMatrix<double,_3> tmp;
  SquareMatrix3<double> result;
  double local_e8 [17];
  double local_60;
  double local_58 [9];
  
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])();
  (this->super_NPT).NkBT =
       (double)((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_)->
               nGlobalIntegrableObjects_ * 8.31451e-07 * (this->super_NPT).targetTemp;
  this_00 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar10 = Thermo::getTotalEnergy(this_00);
  pdVar3 = local_58;
  local_58[6] = 0.0;
  local_58[7] = 0.0;
  local_58[4] = 0.0;
  local_58[5] = 0.0;
  local_58[2] = 0.0;
  local_58[3] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  local_58[8] = 0.0;
  lVar4 = 0;
  pMVar5 = &this->eta;
  do {
    lVar7 = 0;
    pdVar6 = pdVar3;
    do {
      *pdVar6 = (pMVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                [lVar7];
      lVar7 = lVar7 + 1;
      pdVar6 = pdVar6 + 3;
    } while (lVar7 != 3);
    lVar4 = lVar4 + 1;
    pdVar3 = pdVar3 + 1;
    pMVar5 = (Mat3x3d *)
             ((pMVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar4 != 3);
  local_e8[6] = 0.0;
  local_e8[7] = 0.0;
  local_e8[4] = 0.0;
  local_e8[5] = 0.0;
  local_e8[2] = 0.0;
  local_e8[3] = 0.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[8] = 0.0;
  pdVar3 = local_58;
  lVar4 = 0;
  do {
    lVar7 = 0;
    pMVar5 = &this->eta;
    do {
      dVar11 = local_e8[lVar4 * 3 + lVar7];
      lVar9 = 0;
      pMVar8 = pMVar5;
      do {
        dVar11 = dVar11 + pdVar3[lVar9] *
                          (pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][0];
        lVar9 = lVar9 + 1;
        pMVar8 = (Mat3x3d *)
                 ((pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                 );
      } while (lVar9 != 3);
      local_e8[lVar4 * 3 + lVar7] = dVar11;
      lVar7 = lVar7 + 1;
      pMVar5 = (Mat3x3d *)
               ((pMVar5->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
               1);
    } while (lVar7 != 3);
    lVar4 = lVar4 + 1;
    pdVar3 = pdVar3 + 3;
  } while (lVar4 != 3);
  lVar4 = 0;
  do {
    *(undefined8 *)((long)local_e8 + lVar4 + 0x58) = *(undefined8 *)((long)local_e8 + lVar4 + 0x10);
    *(undefined8 *)((long)local_e8 + lVar4 + 0x48) = *(undefined8 *)((long)local_e8 + lVar4);
    *(undefined8 *)((long)local_e8 + lVar4 + 0x50) = *(undefined8 *)((long)local_e8 + lVar4 + 8);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  dVar11 = (this->super_NPT).NkBT;
  dVar1 = (this->super_NPT).targetPressure;
  dVar2 = (this->super_NPT).tb2;
  RVar12 = Thermo::getVolume(this_00);
  auVar13._0_8_ = dVar11 * dVar2 * (local_e8[9] + 0.0 + local_e8[0xd] + local_60);
  auVar13._8_8_ = (RVar12 * dVar1) / 163882576.0;
  auVar13 = divpd(auVar13,_DAT_0029f7b0);
  return auVar13._8_8_ + RVar10 + auVar13._0_8_;
}

Assistant:

RealType NPA::calcConservedQuantity() {
    loadEta();

    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    RealType conservedQuantity;
    RealType totalEnergy;
    RealType barostat_kinetic;
    RealType barostat_potential;
    RealType trEta;

    totalEnergy = thermo.getTotalEnergy();

    SquareMatrix<RealType, 3> tmp = eta.transpose() * eta;
    trEta                         = tmp.trace();

    barostat_kinetic = NkBT * tb2 * trEta / (2.0 * Constants::energyConvert);

    barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    conservedQuantity = totalEnergy + barostat_kinetic + barostat_potential;

    return conservedQuantity;
  }